

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O3

int __thiscall
Fl_Menu_Item::insert
          (Fl_Menu_Item *this,int index,char *mytext,int sc,Fl_Callback *cb,void *data,int myflags)

{
  char cVar1;
  uint uVar2;
  int size;
  char *pcVar3;
  Fl_Menu_Item *pFVar4;
  char cVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  char buf [1024];
  char local_438 [1032];
  
  size = local_array_size;
  if (local_array != this) {
    size = Fl_Menu_Item::size(this);
  }
  pFVar4 = this;
LAB_00184ec5:
  pcVar3 = local_438;
  if (*mytext == '_') {
    mytext = mytext + 1;
    uVar2 = 0x80;
  }
  else {
    uVar9 = 0;
    pcVar6 = mytext;
    uVar2 = 0;
    if (*mytext == '/') goto LAB_00184fea;
  }
  do {
    uVar9 = uVar2;
    cVar5 = *mytext;
    if (cVar5 == '\\') {
      pcVar6 = mytext + 1;
      cVar5 = mytext[1];
      if (cVar5 == '\0') {
        cVar5 = '\\';
        pcVar6 = mytext;
      }
    }
    else if ((cVar5 == '\0') || (pcVar6 = mytext, cVar5 == '/')) break;
    mytext = pcVar6 + 1;
    *pcVar3 = cVar5;
    pcVar3 = pcVar3 + 1;
    uVar2 = uVar9;
  } while( true );
  *pcVar3 = '\0';
  pcVar6 = local_438;
  if (*mytext != '/') goto LAB_00184fea;
  pcVar3 = pFVar4->text;
  while (pcVar3 != (char *)0x0) {
    pcVar6 = local_438;
    if ((pFVar4->flags & 0x40) != 0) {
      while( true ) {
        cVar5 = *pcVar6;
        for (; cVar1 = *pcVar3, cVar5 != cVar1; pcVar3 = pcVar3 + 1) {
          if (cVar5 == '&') goto LAB_00184f5d;
          if (cVar1 != '&') {
            if (cVar5 == cVar1) goto LAB_00184fd5;
            goto LAB_00184f67;
          }
        }
        if (cVar5 == '\0') break;
        pcVar3 = pcVar3 + 1;
LAB_00184f5d:
        pcVar6 = pcVar6 + 1;
      }
      goto LAB_00184fd5;
    }
LAB_00184f67:
    pFVar4 = next(pFVar4,1);
    pcVar3 = pFVar4->text;
  }
  iVar8 = (int)((long)pFVar4 - (long)this >> 3) * -0x49249249;
  pFVar4 = array_insert(this,size,iVar8,local_438,uVar9 | 0x40);
  this = array_insert(pFVar4,size + 1,iVar8 + 1,(char *)0x0,0);
  size = size + 2;
  pFVar4 = this + iVar8;
LAB_00184fd5:
  mytext = mytext + 1;
  pFVar4 = pFVar4 + 1;
  index = -1;
  goto LAB_00184ec5;
LAB_00184fea:
  pcVar3 = pFVar4->text;
  do {
    if (pcVar3 == (char *)0x0) {
      if (index == -1) {
        index = (int)((ulong)((long)pFVar4 - (long)this) >> 3) * -0x49249249;
      }
      this = array_insert(this,size,index,pcVar6,uVar9 | myflags);
      iVar8 = size + 1;
      if ((myflags & 0x40U) != 0) {
        this = array_insert(this,iVar8,index + 1,(char *)0x0,0);
        iVar8 = size + 2;
      }
      pFVar4 = this + index;
      size = iVar8;
LAB_001850c8:
      pFVar4->shortcut_ = sc;
      pFVar4->callback_ = cb;
      pFVar4->user_data_ = data;
      pFVar4->flags = uVar9 | myflags;
      if (this == local_array) {
        local_array_size = size;
      }
      return (int)((ulong)((long)pFVar4 - (long)this) >> 3) * -0x49249249;
    }
    pcVar7 = pcVar6;
    if ((pFVar4->flags & 0x40) == 0) {
      while( true ) {
        cVar5 = *pcVar3;
        for (; cVar1 = *pcVar7, cVar5 != cVar1; pcVar7 = pcVar7 + 1) {
          if (cVar5 == '&') goto LAB_00185027;
          if (cVar1 != '&') {
            if (cVar5 == cVar1) goto LAB_001850c8;
            goto LAB_00185035;
          }
        }
        if (cVar5 == '\0') break;
        pcVar7 = pcVar7 + 1;
LAB_00185027:
        pcVar3 = pcVar3 + 1;
      }
      goto LAB_001850c8;
    }
LAB_00185035:
    pFVar4 = next(pFVar4,1);
    pcVar3 = pFVar4->text;
  } while( true );
}

Assistant:

int Fl_Menu_Item::insert(
  int index,
  const char *mytext,
  int sc,
  Fl_Callback *cb,	
  void *data,
  int myflags
) {
  Fl_Menu_Item *array = this;
  Fl_Menu_Item *m = this;
  const char *p;
  char *q;
  char buf[1024];

  int msize = array==local_array ? local_array_size : array->size();
  int flags1 = 0;
  const char* item;

  // split at slashes to make submenus:
  for (;;) {

    // leading slash makes us assume it is a filename:
    if (*mytext == '/') {item = mytext; break;}

    // leading underscore causes divider line:
    if (*mytext == '_') {mytext++; flags1 = FL_MENU_DIVIDER;}

    // copy to buf, changing \x to x:
    q = buf;
    for (p=mytext; *p && *p != '/'; *q++ = *p++) if (*p=='\\' && p[1]) p++;
    *q = 0;

    item = buf;
    if (*p != '/') break; /* not a menu title */
    index = -1;           /* any submenu specified overrides insert position */
    mytext = p+1;         /* point at item title */

    /* find a matching menu title: */
    for (; m->text; m = m->next())
      if (m->flags&FL_SUBMENU && !compare(item, m->text)) break;

    if (!m->text) { /* create a new menu */
      int n = (index==-1) ? (int) (m-array) : index;
      array = array_insert(array, msize, n, item, FL_SUBMENU|flags1);
      msize++;
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
      m = array+n;
    }
    m++;	/* go into the submenu */
    flags1 = 0;
  }

  /* find a matching menu item: */
  for (; m->text; m = m->next())
    if (!(m->flags&FL_SUBMENU) && !compare(m->text,item)) break;

  if (!m->text) {	/* add a new menu item */
    int n = (index==-1) ? (int) (m-array) : index;
    array = array_insert(array, msize, n, item, myflags|flags1);
    msize++;
    if (myflags & FL_SUBMENU) { // add submenu delimiter
      array = array_insert(array, msize, n+1, 0, 0);
      msize++;
    }
    m = array+n;
  }

  /* fill it in */
  m->shortcut_ = sc;
  m->callback_ = cb;
  m->user_data_ = data;
  m->flags = myflags|flags1;

  if (array == local_array) local_array_size = msize;
  return (int) (m-array);
}